

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QWizardField>::copyAppend
          (QGenericArrayOps<QWizardField> *this,QWizardField *b,QWizardField *e)

{
  QWizardField *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QObject *pQVar4;
  undefined7 uVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QWizardField>).ptr;
    qVar6 = (this->super_QArrayDataPointer<QWizardField>).size;
    do {
      pQVar1[qVar6].page = b->page;
      pDVar2 = (b->name).d.d;
      pQVar1[qVar6].name.d.d = pDVar2;
      pQVar1[qVar6].name.d.ptr = (b->name).d.ptr;
      pQVar1[qVar6].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uVar5 = *(undefined7 *)&b->field_0x21;
      pQVar4 = b->object;
      pQVar1[qVar6].mandatory = b->mandatory;
      *(undefined7 *)&pQVar1[qVar6].field_0x21 = uVar5;
      pQVar1[qVar6].object = pQVar4;
      pDVar3 = (b->property).d.d;
      pQVar1[qVar6].property.d.d = pDVar3;
      pQVar1[qVar6].property.d.ptr = (b->property).d.ptr;
      pQVar1[qVar6].property.d.size = (b->property).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = (b->changedSignal).d.d;
      pQVar1[qVar6].changedSignal.d.d = pDVar3;
      pQVar1[qVar6].changedSignal.d.ptr = (b->changedSignal).d.ptr;
      pQVar1[qVar6].changedSignal.d.size = (b->changedSignal).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar1[qVar6].initialValue,&b->initialValue);
      qVar6 = (this->super_QArrayDataPointer<QWizardField>).size + 1;
      (this->super_QArrayDataPointer<QWizardField>).size = qVar6;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }